

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.h
# Opt level: O3

void __thiscall Liby::udp_io_task::~udp_io_task(udp_io_task *this)

{
  function<void_()> *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  __ptr = (this->handler_)._M_t.
          super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
          .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
  if (__ptr != (function<void_()> *)0x0) {
    std::default_delete<std::function<void_()>_>::operator()
              ((default_delete<std::function<void_()>_> *)&this->handler_,__ptr);
  }
  (this->handler_)._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl = (function<void_()> *)0x0;
  this_00 = (this->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

udp_io_task() = default;